

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall mp::NLFeeder_Easy::FillNonlinearVars(NLFeeder_Easy *this)

{
  NLModel *this_00;
  size_type __n;
  NLFeeder_Easy *in_RDI;
  size_t i;
  NLW2_SparseMatrix_C Q;
  reference local_48;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffd0;
  size_type local_28;
  
  this_00 = NLME(in_RDI);
  NLModel::NumCols(this_00);
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)this,(size_type)Q.value_,Q.index_._7_1_);
  NLME(in_RDI);
  NLModel::Hessian(&in_RDI->nlme_);
  if (local_28 != 0) {
    (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_nl_objs =
         (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_nl_objs + 1;
    while (__n = local_28 - 1, local_28 != 0) {
      local_48 = std::vector<bool,_std::allocator<bool>_>::operator[](in_stack_ffffffffffffffd0,__n)
      ;
      std::_Bit_reference::operator=(&local_48,true);
      (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_nl_vars_in_objs =
           (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_nl_vars_in_objs + 1;
      local_28 = __n;
    }
  }
  return;
}

Assistant:

void FillNonlinearVars() {
    nlv_obj_.resize(NLME().NumCols());
    auto Q=NLME().Hessian();
    if (Q.num_nz_) {
      ++header_.num_nl_objs;                // STATS
      for (auto i=Q.num_nz_; i--; ) {
        assert(i<nlv_obj_.size());
        nlv_obj_[Q.index_[i]] = true;
        ++header_.num_nl_vars_in_objs;      // STATS
      }
    }
  }